

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw.cxx
# Opt level: O1

int fl_height(int font,int size)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = fl_graphics_driver->font_;
  if ((uVar1 == font) && (fl_graphics_driver->size_ == size)) {
    iVar3 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
    return iVar3;
  }
  uVar2 = fl_graphics_driver->size_;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])();
  iVar3 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)uVar1,(ulong)uVar2);
  return iVar3;
}

Assistant:

int fl_height(int font, int size) {
    if ( font == fl_font() && size == fl_size() ) return(fl_height());
    int tf = fl_font(), ts = fl_size();   // save
    fl_font(font,size);
    int height = fl_height();
    fl_font(tf,ts);                       // restore
    return(height);
}